

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

_Bool v7m_cpacr_pass(CPUARMState_conflict *env,_Bool is_secure,_Bool is_priv)

{
  undefined3 in_register_00000031;
  
  switch((env->v7m).cpacr[CONCAT31(in_register_00000031,is_secure)] >> 0x14 & 3) {
  default:
    is_priv = false;
switchD_005b58d1_caseD_1:
    return is_priv;
  case 1:
    goto switchD_005b58d1_caseD_1;
  case 3:
    return true;
  }
}

Assistant:

static inline bool v7m_cpacr_pass(CPUARMState *env,
                                  bool is_secure, bool is_priv)
{
    switch (extract32(env->v7m.cpacr[is_secure], 20, 2)) {
    case 0:
    case 2: /* UNPREDICTABLE: we treat like 0 */
        return false;
    case 1:
        return is_priv;
    case 3:
        return true;
    default:
        g_assert_not_reached();
        // never reach here
        return true;
    }
}